

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  uint32 *buffer;
  uint32 local_1c [2];
  uint8 bytes [4];
  
  buffer = (uint32 *)this->buffer_;
  if ((*(int *)&this->buffer_end_ - (int)buffer & 0xfffffffcU) == 0) {
    buffer = local_1c;
    bVar1 = ReadRaw(this,buffer,4);
    if (!bVar1) {
      return false;
    }
  }
  else {
    this->buffer_ = (uint8 *)(buffer + 1);
  }
  *value = *buffer;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}